

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O0

void stbir__buffer_loop_upsample(stbir__info *stbir_info)

{
  int iVar1;
  float fVar2;
  int local_28;
  int local_24;
  int in_last_scanline;
  int in_first_scanline;
  float in_center_of_out;
  float out_scanlines_radius;
  float scale_ratio;
  int y;
  stbir__info *stbir_info_local;
  
  in_center_of_out = stbir_info->vertical_scale;
  _scale_ratio = stbir_info;
  fVar2 = (*stbir__filter_info_table[stbir_info->vertical_filter].support)(1.0 / in_center_of_out);
  in_first_scanline = (int)(fVar2 * in_center_of_out);
  iVar1 = stbir__use_height_upsampling(_scale_ratio);
  if (iVar1 == 0) {
    __assert_fail("stbir__use_height_upsampling(stbir_info)",
                  "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                  ,0x816,"void stbir__buffer_loop_upsample(stbir__info *)");
  }
  out_scanlines_radius = 0.0;
  do {
    if (_scale_ratio->output_h <= (int)out_scanlines_radius) {
      return;
    }
    in_last_scanline = 0;
    local_24 = 0;
    local_28 = 0;
    stbir__calculate_sample_range_upsample
              ((int)out_scanlines_radius,(float)in_first_scanline,in_center_of_out,
               _scale_ratio->vertical_shift,&local_24,&local_28,(float *)&in_last_scanline);
    if (_scale_ratio->ring_buffer_num_entries < (local_28 - local_24) + 1) {
      __assert_fail("in_last_scanline - in_first_scanline + 1 <= stbir_info->ring_buffer_num_entries"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                    ,0x81f,"void stbir__buffer_loop_upsample(stbir__info *)");
    }
    if (-1 < _scale_ratio->ring_buffer_begin_index) {
      while (_scale_ratio->ring_buffer_first_scanline < local_24) {
        if (_scale_ratio->ring_buffer_first_scanline == _scale_ratio->ring_buffer_last_scanline) {
          _scale_ratio->ring_buffer_begin_index = -1;
          _scale_ratio->ring_buffer_first_scanline = 0;
          _scale_ratio->ring_buffer_last_scanline = 0;
          break;
        }
        _scale_ratio->ring_buffer_first_scanline = _scale_ratio->ring_buffer_first_scanline + 1;
        _scale_ratio->ring_buffer_begin_index =
             (_scale_ratio->ring_buffer_begin_index + 1) % _scale_ratio->ring_buffer_num_entries;
      }
    }
    if (_scale_ratio->ring_buffer_begin_index < 0) {
      stbir__decode_and_resample_upsample(_scale_ratio,local_24);
    }
    while (_scale_ratio->ring_buffer_last_scanline < local_28) {
      stbir__decode_and_resample_upsample(_scale_ratio,_scale_ratio->ring_buffer_last_scanline + 1);
    }
    stbir__resample_vertical_upsample(_scale_ratio,(int)out_scanlines_radius);
    out_scanlines_radius = (float)((int)out_scanlines_radius + 1);
  } while( true );
}

Assistant:

static void stbir__buffer_loop_upsample(stbir__info* stbir_info)
{
    int y;
    float scale_ratio = stbir_info->vertical_scale;
    float out_scanlines_radius = stbir__filter_info_table[stbir_info->vertical_filter].support(1/scale_ratio) * scale_ratio;

    STBIR_ASSERT(stbir__use_height_upsampling(stbir_info));

    for (y = 0; y < stbir_info->output_h; y++)
    {
        float in_center_of_out = 0; // Center of the current out scanline in the in scanline space
        int in_first_scanline = 0, in_last_scanline = 0;

        stbir__calculate_sample_range_upsample(y, out_scanlines_radius, scale_ratio, stbir_info->vertical_shift, &in_first_scanline, &in_last_scanline, &in_center_of_out);

        STBIR_ASSERT(in_last_scanline - in_first_scanline + 1 <= stbir_info->ring_buffer_num_entries);

        if (stbir_info->ring_buffer_begin_index >= 0)
        {
            // Get rid of whatever we don't need anymore.
            while (in_first_scanline > stbir_info->ring_buffer_first_scanline)
            {
                if (stbir_info->ring_buffer_first_scanline == stbir_info->ring_buffer_last_scanline)
                {
                    // We just popped the last scanline off the ring buffer.
                    // Reset it to the empty state.
                    stbir_info->ring_buffer_begin_index = -1;
                    stbir_info->ring_buffer_first_scanline = 0;
                    stbir_info->ring_buffer_last_scanline = 0;
                    break;
                }
                else
                {
                    stbir_info->ring_buffer_first_scanline++;
                    stbir_info->ring_buffer_begin_index = (stbir_info->ring_buffer_begin_index + 1) % stbir_info->ring_buffer_num_entries;
                }
            }
        }

        // Load in new ones.
        if (stbir_info->ring_buffer_begin_index < 0)
            stbir__decode_and_resample_upsample(stbir_info, in_first_scanline);

        while (in_last_scanline > stbir_info->ring_buffer_last_scanline)
            stbir__decode_and_resample_upsample(stbir_info, stbir_info->ring_buffer_last_scanline + 1);

        // Now all buffers should be ready to write a row of vertical sampling.
        stbir__resample_vertical_upsample(stbir_info, y);

        STBIR_PROGRESS_REPORT((float)y / stbir_info->output_h);
    }
}